

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
int_writer<unsigned_int,fmt::v5::basic_format_specs<char>>::dec_writer::operator()
          (dec_writer *this,char **it)

{
  int iVar1;
  char *__dest;
  bool bVar2;
  undefined1 *puVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  ptrdiff_t _Num;
  size_t __n;
  undefined1 local_25 [13];
  
  iVar1 = *(int *)(this + 4);
  __n = (size_t)iVar1;
  if ((long)__n < 0) {
    __assert_fail("(num_digits >= 0) && \"invalid digit count\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tinfoilboy[P]sonne/extern/fmt/include/fmt/format.h"
                  ,0x3dd,
                  "Iterator fmt::internal::format_decimal(Iterator, UInt, int, ThousandsSep) [OutChar = char, UInt = unsigned int, Iterator = char *, ThousandsSep = fmt::internal::no_thousands_sep]"
                 );
  }
  uVar6 = *(uint *)this;
  puVar3 = local_25 + __n;
  uVar5 = uVar6;
  if (99 < uVar6) {
    do {
      uVar5 = uVar6 / 100;
      *(undefined2 *)(puVar3 + -2) =
           *(undefined2 *)(internal::basic_data<void>::DIGITS + (ulong)(uVar6 % 100) * 2);
      puVar3 = puVar3 + -2;
      bVar2 = 9999 < uVar6;
      uVar6 = uVar6 / 100;
    } while (bVar2);
  }
  __dest = *it;
  if (uVar5 < 10) {
    bVar4 = (byte)uVar5 | 0x30;
    lVar7 = -1;
  }
  else {
    puVar3[-1] = internal::basic_data<void>::DIGITS[((ulong)uVar5 * 2 & 0xffffffff) + 1];
    bVar4 = internal::basic_data<void>::DIGITS[(ulong)uVar5 * 2];
    lVar7 = -2;
  }
  puVar3[lVar7] = bVar4;
  if (iVar1 != 0) {
    memcpy(__dest,local_25,__n);
  }
  *it = __dest + __n;
  return;
}

Assistant:

void operator()(It &&it) const {
        it = internal::format_decimal<char_type>(it, abs_value, num_digits);
      }